

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O3

Validator * __thiscall CLI::Option::get_validator(Option *this,string *Validator_name)

{
  Validator *pVVar1;
  Validator *pVVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  OptionNotFound *this_00;
  long *plVar4;
  size_type *psVar5;
  Validator *Validator;
  Validator *pVVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar1 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    __s1 = (Validator_name->_M_dataplus)._M_p;
    __n = Validator_name->_M_string_length;
    pVVar6 = pVVar1;
    do {
      if (__n == (pVVar6->name_)._M_string_length) {
        if (__n == 0) {
          return pVVar6;
        }
        iVar3 = bcmp(__s1,(pVVar6->name_)._M_dataplus._M_p,__n);
        if (iVar3 == 0) {
          return pVVar6;
        }
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != pVVar2);
    if ((__n == 0) && (pVVar1 != pVVar2)) {
      return pVVar1;
    }
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Validator ","");
  ::std::operator+(&local_50,&local_90,Validator_name);
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  OptionNotFound::OptionNotFound(this_00,&local_70);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE Validator *Option::get_validator(const std::string &Validator_name) {
    for(auto &Validator : validators_) {
        if(Validator_name == Validator.get_name()) {
            return &Validator;
        }
    }
    if((Validator_name.empty()) && (!validators_.empty())) {
        return &(validators_.front());
    }
    throw OptionNotFound(std::string{"Validator "} + Validator_name + " Not Found");
}